

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall SymbolKey::SymbolKey(SymbolKey *this,Identifier *name,int file,int section)

{
  string *psVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  int section_local;
  int file_local;
  Identifier *name_local;
  SymbolKey *this_local;
  
  psVar1 = Identifier::string_abi_cxx11_(name);
  std::__cxx11::string::string((string *)this,(string *)psVar1);
  this->file = file;
  this->section = section;
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            (__first,__last,__result,tolower);
  return;
}

Assistant:

SymbolKey(const Identifier& name, int file, int section) :
		name(name.string()),
		file(file),
		section(section)
	{
		std::transform(this->name.begin(), this->name.end(), this->name.begin(), ::tolower);
	}